

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

bool __thiscall Tetris::place(Tetris *this)

{
  bool bVar1;
  Tetris *in_RDI;
  int tmpY;
  int tmpX;
  int i;
  int local_14;
  bool local_1;
  
  bVar1 = onGround(in_RDI);
  if (bVar1) {
    for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
      in_RDI->gameBoard->gridInfo[in_RDI->color]
      [in_RDI->blockX + in_RDI->shape[in_RDI->orientation][local_14 << 1]]
      [in_RDI->blockY + in_RDI->shape[in_RDI->orientation][local_14 * 2 + 1]] = 2;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Tetris::place()
{
    if (!onGround())
        return false;

    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = blockX + shape[orientation][2 * i];
        tmpY = blockY + shape[orientation][2 * i + 1];
        gameBoard->gridInfo[color][tmpX][tmpY] = 2;
    }
    return true;
}